

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.c
# Opt level: O2

_Bool chck_buffer_read_string(char **str,size_t *len,chck_buffer *buf)

{
  _Bool _Var1;
  uint8_t bits;
  
  if ((str != (char **)0x0) && (buf != (chck_buffer *)0x0)) {
    *str = (char *)0x0;
    if (len != (size_t *)0x0) {
      *len = 0;
    }
    _Var1 = chck_buffer_read_int(&bits,CHCK_BUFFER_B8,buf);
    if (_Var1) {
      _Var1 = chck_buffer_read_string_of_type(str,len,(uint)bits,buf);
    }
    else {
      _Var1 = false;
    }
    return _Var1;
  }
  __assert_fail("str && buf",
                "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/buffer.c"
                ,0x151,"_Bool chck_buffer_read_string(char **, size_t *, struct chck_buffer *)");
}

Assistant:

bool
chck_buffer_read_string(char **str, size_t *len, struct chck_buffer *buf)
{
   assert(str && buf);
   *str = NULL;

   if (len)
      *len = 0;

   uint8_t bits;
   if (unlikely(!chck_buffer_read_int(&bits, sizeof(bits), buf)))
      return false;

   return likely(chck_buffer_read_string_of_type(str, len, bits, buf));
}